

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::UnitTestImpl::AddTestInfo
          (UnitTestImpl *this,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ostream *poVar2;
  TestCase *this_00;
  pointer type_param;
  GTestLog local_50 [8];
  
  if ((this->original_working_dir_).pathname_._M_string_length == 0) {
    FilePath::GetCurrentDir();
    std::__cxx11::string::_M_assign((string *)&this->original_working_dir_);
    std::__cxx11::string::~string((string *)local_50);
    if ((this->original_working_dir_).pathname_._M_string_length == 0) {
      GTestLog::GTestLog(local_50,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/TonsenWei[P]gtest_win/test/googletest-release-1.8.1/googletest/src/gtest-internal-inl.h"
                         ,0x297);
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Condition !original_working_dir_.IsEmpty() failed. ");
      std::operator<<(poVar2,"Failed to get the current working directory.");
      GTestLog::~GTestLog(local_50);
    }
  }
  pbVar1 = (test_info->type_param_).ptr_;
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    type_param = (char *)0x0;
  }
  else {
    type_param = (pbVar1->_M_dataplus)._M_p;
  }
  this_00 = GetTestCase(this,(test_info->test_case_name_)._M_dataplus._M_p,type_param,set_up_tc,
                        tear_down_tc);
  TestCase::AddTestInfo(this_00,test_info);
  return;
}

Assistant:

void AddTestInfo(Test::SetUpTestCaseFunc set_up_tc,
                   Test::TearDownTestCaseFunc tear_down_tc,
                   TestInfo* test_info) {
    // In order to support thread-safe death tests, we need to
    // remember the original working directory when the test program
    // was first invoked.  We cannot do this in RUN_ALL_TESTS(), as
    // the user may have changed the current directory before calling
    // RUN_ALL_TESTS().  Therefore we capture the current directory in
    // AddTestInfo(), which is called to register a TEST or TEST_F
    // before main() is reached.
    if (original_working_dir_.IsEmpty()) {
      original_working_dir_.Set(FilePath::GetCurrentDir());
      GTEST_CHECK_(!original_working_dir_.IsEmpty())
          << "Failed to get the current working directory.";
    }

    GetTestCase(test_info->test_case_name(),
                test_info->type_param(),
                set_up_tc,
                tear_down_tc)->AddTestInfo(test_info);
  }